

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O1

int __thiscall
CCommandManager::Filter
          (CCommandManager *this,array<bool,_allocator_default<bool>_> *aFilter,char *pStr,
          bool Exact)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/game/commands.h"
                 ,0x94,(uint)(aFilter->num_elements == (this->m_aCommands).num_elements),
                 "filter size must match command count");
  if (*pStr == '\0') {
    if (0 < (long)aFilter->num_elements) {
      memset(aFilter->list,0,(long)aFilter->num_elements);
      return 0;
    }
  }
  else {
    iVar3 = (this->m_aCommands).num_elements;
    if (Exact) {
      if (0 < iVar3) {
        lVar4 = 0;
        lVar5 = 0;
        iVar3 = 0;
        do {
          iVar1 = str_comp(((this->m_aCommands).list)->m_aName + lVar4,pStr);
          aFilter->list[lVar5] = iVar1 != 0;
          iVar3 = iVar3 + (uint)(iVar1 != 0);
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0xa0;
        } while (lVar5 < (this->m_aCommands).num_elements);
        return iVar3;
      }
    }
    else if (0 < iVar3) {
      lVar4 = 0;
      lVar5 = 0;
      iVar3 = 0;
      do {
        pcVar2 = str_find_nocase(((this->m_aCommands).list)->m_aName + lVar4,pStr);
        bVar6 = ((this->m_aCommands).list)->m_aName + lVar4 != pcVar2;
        aFilter->list[lVar5] = bVar6;
        iVar3 = iVar3 + (uint)bVar6;
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0xa0;
      } while (lVar5 < (this->m_aCommands).num_elements);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

int Filter(array<bool> &aFilter, const char *pStr, bool Exact)
    {
        dbg_assert(aFilter.size() == m_aCommands.size(), "filter size must match command count");
        if(!*pStr)
        {
            for(int i = 0; i < aFilter.size(); i++)
                aFilter[i] = false;
            return 0;
        }

        int Filtered = 0;
        if(Exact)
        {
            for(int i = 0; i < m_aCommands.size(); i++)
                Filtered += (aFilter[i] = str_comp(m_aCommands[i].m_aName, pStr));
        }
        else
        {
            for(int i = 0; i < m_aCommands.size(); i++)
                Filtered += (aFilter[i] = str_find_nocase(m_aCommands[i].m_aName, pStr) != m_aCommands[i].m_aName);
        }

        return Filtered;
    }